

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_x86_avx.cpp
# Opt level: O3

int __thiscall
ncnn::Convolution_x86_avx::forwardDilation_x86
          (Convolution_x86_avx *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  undefined1 auVar1 [32];
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  uint uVar12;
  int iVar13;
  size_t _elemsize;
  _func_int **pp_Var14;
  size_t sVar15;
  size_t sVar16;
  Layer *pLVar17;
  ulong uVar18;
  int *piVar19;
  int iVar20;
  ulong uVar21;
  Allocator *pAVar22;
  ulong uVar23;
  Allocator *pAVar24;
  undefined4 *puVar25;
  ulong uVar26;
  int iVar27;
  int iVar28;
  uint _w;
  long lVar29;
  undefined4 *puVar30;
  long lVar31;
  int iVar32;
  _func_int *p_Var33;
  undefined4 *puVar34;
  uint _h;
  ulong uVar35;
  Option opt_g;
  int local_1c8;
  long local_178;
  long local_170;
  Mat local_158;
  Mat local_108;
  long local_c0;
  long local_b8;
  ulong local_b0;
  long local_a8;
  long local_a0;
  ulong local_98;
  ulong local_90;
  long local_88;
  long local_80;
  undefined8 local_78;
  Allocator *pAStack_70;
  undefined1 auStack_68 [16];
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 uStack_48;
  undefined8 uStack_40;
  undefined8 uVar2;
  undefined4 uVar3;
  undefined1 uVar4;
  undefined1 uVar5;
  undefined1 uVar6;
  undefined1 uVar7;
  
  iVar8 = bottom_blob->w;
  iVar9 = bottom_blob->h;
  _elemsize = bottom_blob->elemsize;
  p_Var33 = this->_vptr_Convolution_x86_avx[-3];
  iVar10 = *(int *)((long)&(this->weight_winograd23_data).d + (long)p_Var33);
  iVar11 = *(int *)((long)&(this->weight_winograd23_data).cstep + (long)(p_Var33 + 4));
  uVar12 = *(uint *)(&(this->weight_winograd23_data).field_0x3c + (long)p_Var33);
  uVar21 = (ulong)uVar12;
  iVar28 = (iVar10 + -1) * uVar12 + 1;
  iVar20 = (iVar8 - iVar28) / iVar11;
  iVar27 = iVar20 + 1;
  Mat::create(top_blob,iVar27,(iVar9 - iVar28) / iVar11 + 1,
              *(int *)((long)&(this->weight_winograd23_data).h + (long)p_Var33),_elemsize,
              opt->blob_allocator);
  local_1c8 = -100;
  if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
    local_108.cstep = 0;
    local_158.data = (Allocator *)0x0;
    local_158.refcount._0_4_ = 0;
    local_158.refcount._4_4_ = 0;
    local_108.elemsize = SUB168(ZEXT816(0) << 0x40,4);
    local_158.elempack = 0;
    local_158.cstep = 0;
    local_158.elemsize = local_108.elemsize;
    local_158.allocator = (Allocator *)local_158.data;
    local_158.dims = (int)local_158.refcount;
    local_158.w = local_158.refcount._4_4_;
    local_158._48_8_ = local_108.elemsize;
    local_158.c = local_158.elempack;
    local_108.data = local_158.data;
    local_108.refcount._0_4_ = (int)local_158.refcount;
    local_108.refcount._4_4_ = local_158.refcount._4_4_;
    local_108.elempack = local_158.elempack;
    local_108.allocator = (Allocator *)local_158.data;
    local_108.dims = (int)local_158.refcount;
    local_108.w = local_158.refcount._4_4_;
    local_108._48_8_ = local_108.elemsize;
    local_108.c = local_158.elempack;
    if (0 < (int)uVar12) {
      local_b8 = (long)iVar8 << 2;
      local_c0 = (long)iVar20 * 4 + 4;
      local_80 = (long)(int)(iVar27 * uVar12) << 2;
      local_178 = 0;
      local_170 = 0;
      uVar23 = 0;
      do {
        uVar18 = (long)(int)((uVar12 + iVar9 + -1) - (int)uVar23) / (long)(int)uVar12;
        iVar20 = (int)uVar18;
        uVar26 = (long)(iVar20 - iVar10) / (long)iVar11;
        local_90 = uVar26 & 0xffffffff;
        _h = (int)uVar26 + 1;
        uVar26 = 0;
        local_b0 = uVar23;
        local_a8 = local_170;
        local_a0 = local_178;
        do {
          uVar23 = (long)(int)((uVar12 + iVar8 + -1) - (int)uVar26) / (long)(int)uVar12;
          iVar28 = (int)uVar23;
          iVar27 = (iVar28 - iVar10) / iVar11;
          local_98 = uVar26;
          Mat::create(&local_108,iVar28,iVar20,bottom_blob->c,_elemsize,opt->workspace_allocator);
          local_1c8 = -100;
          if (((Allocator *)local_108.data == (Allocator *)0x0) ||
             ((long)local_108.c * local_108.cstep == 0)) goto LAB_0024bf03;
          _w = iVar27 + 1;
          Mat::create(&local_158,_w,_h,
                      *(int *)((long)&(this->weight_winograd23_data).h +
                              (long)this->_vptr_Convolution_x86_avx[-3]),_elemsize,
                      opt->workspace_allocator);
          if (((Allocator *)local_158.data == (Allocator *)0x0) ||
             ((long)local_158.c * local_158.cstep == 0)) goto LAB_0024bf03;
          iVar13 = bottom_blob->c;
          if (0 < (long)iVar13) {
            lVar29 = (long)bottom_blob->data + local_170;
            local_88 = bottom_blob->cstep * bottom_blob->elemsize;
            lVar31 = 0;
            pAVar22 = (Allocator *)local_108.data;
            do {
              if (0 < iVar20) {
                iVar32 = 0;
                uVar26 = 0;
                pAVar24 = pAVar22;
                do {
                  if (0 < iVar28) {
                    puVar25 = (undefined4 *)(lVar29 + (long)iVar32 * 4);
                    uVar35 = 0;
                    do {
                      *(undefined4 *)((long)&pAVar24->_vptr_Allocator + uVar35 * 4) = *puVar25;
                      uVar35 = uVar35 + 1;
                      puVar25 = puVar25 + uVar21;
                    } while ((uVar23 & 0xffffffff) != uVar35);
                  }
                  uVar26 = uVar26 + 1;
                  iVar32 = iVar32 + uVar12 * iVar8;
                  pAVar24 = (Allocator *)((long)&pAVar24->_vptr_Allocator + (long)iVar28 * 4);
                } while (uVar26 != (uVar18 & 0xffffffff));
              }
              lVar31 = lVar31 + 1;
              lVar29 = lVar29 + local_88;
              pAVar22 = (Allocator *)
                        ((long)&pAVar22->_vptr_Allocator + local_108.cstep * local_108.elemsize);
            } while (lVar31 != iVar13);
          }
          auVar1[0] = opt->lightmode;
          auVar1._1_3_ = *(undefined3 *)&opt->field_0x1;
          auVar1._4_4_ = opt->num_threads;
          auVar1._8_8_ = opt->blob_allocator;
          uVar2 = opt->workspace_allocator;
          uVar3 = opt->openmp_blocktime;
          uVar4 = opt->use_winograd_convolution;
          uVar5 = opt->use_sgemm_convolution;
          uVar6 = opt->use_int8_inference;
          uVar7 = opt->use_vulkan_compute;
          auVar1[0x1f] = uVar7;
          auVar1[0x1e] = uVar6;
          auVar1[0x1d] = uVar5;
          auVar1[0x1c] = uVar4;
          auVar1._24_4_ = uVar3;
          auVar1._16_8_ = uVar2;
          local_58._0_1_ = opt->use_bf16_storage;
          local_58._1_1_ = opt->use_fp16_packed;
          local_58._2_1_ = opt->use_fp16_storage;
          local_58._3_1_ = opt->use_fp16_arithmetic;
          local_58._4_1_ = opt->use_int8_packed;
          local_58._5_1_ = opt->use_int8_storage;
          local_58._6_1_ = opt->use_int8_arithmetic;
          local_58._7_1_ = opt->use_packing_layout;
          uStack_50._0_1_ = opt->use_shader_pack8;
          uStack_50._1_1_ = opt->use_subgroup_basic;
          uStack_50._2_1_ = opt->use_subgroup_vote;
          uStack_50._3_1_ = opt->use_subgroup_ballot;
          uStack_50._4_1_ = opt->use_subgroup_shuffle;
          uStack_50._5_1_ = opt->use_image_storage;
          uStack_50._6_1_ = opt->use_tensor_storage;
          uStack_50._7_1_ = opt->use_reserved_0;
          uStack_48._0_4_ = opt->flush_denormals;
          uStack_48._4_1_ = opt->use_local_pool_allocator;
          uStack_48._5_1_ = opt->use_shader_local_memory;
          uStack_48._6_1_ = opt->use_cooperative_matrix;
          uStack_48._7_1_ = opt->use_winograd23_convolution;
          uStack_40._0_1_ = opt->use_winograd43_convolution;
          uStack_40._1_1_ = opt->use_winograd63_convolution;
          uStack_40._2_1_ = opt->use_reserved_6;
          uStack_40._3_1_ = opt->use_reserved_7;
          uStack_40._4_1_ = opt->use_reserved_8;
          uStack_40._5_1_ = opt->use_reserved_9;
          uStack_40._6_1_ = opt->use_reserved_10;
          uStack_40._7_1_ = opt->use_reserved_11;
          local_78 = auVar1._0_8_;
          pAStack_70 = local_158.allocator;
          auStack_68 = auVar1._16_16_;
          (*this->convolution_dilation1->_vptr_Layer[7])
                    (this->convolution_dilation1,&local_108,&local_158,&local_78);
          pp_Var14 = this->_vptr_Convolution_x86_avx;
          p_Var33 = pp_Var14[-3];
          if (0 < *(int *)((long)&(this->weight_winograd23_data).h + (long)p_Var33)) {
            sVar15 = top_blob->cstep;
            puVar25 = (undefined4 *)((long)top_blob->data + local_178);
            sVar16 = top_blob->elemsize;
            lVar29 = 0;
            pAVar22 = (Allocator *)local_158.data;
            do {
              if (-1 < (int)local_90) {
                uVar23 = 0;
                puVar30 = puVar25;
                pAVar24 = pAVar22;
                do {
                  if (-1 < iVar27) {
                    uVar26 = 0;
                    puVar34 = puVar30;
                    do {
                      *puVar34 = *(undefined4 *)((long)&pAVar24->_vptr_Allocator + uVar26 * 4);
                      uVar26 = uVar26 + 1;
                      puVar34 = puVar34 + uVar21;
                    } while (_w != uVar26);
                  }
                  uVar23 = uVar23 + 1;
                  puVar30 = (undefined4 *)((long)puVar30 + local_80);
                  pAVar24 = (Allocator *)((long)&pAVar24->_vptr_Allocator + (long)(int)_w * 4);
                } while (uVar23 != _h);
                p_Var33 = pp_Var14[-3];
              }
              lVar29 = lVar29 + 1;
              puVar25 = (undefined4 *)((long)puVar25 + sVar15 * sVar16);
              pAVar22 = (Allocator *)
                        ((long)&pAVar22->_vptr_Allocator + local_158.cstep * local_158.elemsize);
            } while (lVar29 < *(int *)((long)&(this->weight_winograd23_data).h + (long)p_Var33));
          }
          uVar26 = local_98 + 1;
          local_170 = local_170 + 4;
          local_178 = local_178 + 4;
        } while (uVar26 != uVar21);
        uVar23 = local_b0 + 1;
        local_170 = local_a8 + local_b8;
        local_178 = local_a0 + local_c0;
      } while (uVar23 != uVar21);
    }
    pLVar17 = this->activation;
    if (pLVar17 == (Layer *)0x0) {
      local_1c8 = 0;
    }
    else {
      (*pLVar17->_vptr_Layer[9])(pLVar17,top_blob,opt);
      local_1c8 = 0;
    }
LAB_0024bf03:
    piVar19 = (int *)CONCAT44(local_158.refcount._4_4_,(int)local_158.refcount);
    if (piVar19 != (int *)0x0) {
      LOCK();
      *piVar19 = *piVar19 + -1;
      UNLOCK();
      if (*piVar19 == 0) {
        if (local_158.allocator == (Allocator *)0x0) {
          if ((Allocator *)local_158.data != (Allocator *)0x0) {
            free(local_158.data);
          }
        }
        else {
          (*(local_158.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    piVar19 = (int *)CONCAT44(local_108.refcount._4_4_,(int)local_108.refcount);
    if (piVar19 != (int *)0x0) {
      LOCK();
      *piVar19 = *piVar19 + -1;
      UNLOCK();
      if (*piVar19 == 0) {
        if (local_108.allocator == (Allocator *)0x0) {
          if ((Allocator *)local_108.data != (Allocator *)0x0) {
            free(local_108.data);
          }
        }
        else {
          (*(local_108.allocator)->_vptr_Allocator[3])();
        }
      }
    }
  }
  return local_1c8;
}

Assistant:

int Convolution_x86_avx::forwardDilation_x86(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    size_t elemsize = bottom_blob.elemsize;

    const int kernel_size = kernel_w;
    const int stride = stride_w;
    const int dilation = dilation_w;
    const int kernel_extent = dilation * (kernel_size - 1) + 1;

    int outw = (w - kernel_extent) / stride + 1;
    int outh = (h - kernel_extent) / stride + 1;

    top_blob.create(outw, outh, num_output, elemsize, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    // Make (dilation * dilation) batches
    Mat inner_bottom_blob;
    Mat inner_top_blob;
    for (int x = 0; x < dilation; x++)
    {
        for (int y = 0; y < dilation; y++)
        {
            int inner_w = (w - y + dilation - 1) / dilation;
            int inner_h = (h - x + dilation - 1) / dilation;

            int inner_outw = (inner_w - kernel_size) / stride + 1;
            int inner_outh = (inner_h - kernel_size) / stride + 1;

            inner_bottom_blob.create(inner_w, inner_h, bottom_blob.c, elemsize, opt.workspace_allocator);
            if (inner_bottom_blob.empty())
                return -100;

            inner_top_blob.create(inner_outw, inner_outh, num_output, elemsize, opt.workspace_allocator);
            if (inner_top_blob.empty())
                return -100;

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int c = 0; c < bottom_blob.c; c++)
            {
                float* outptr = inner_bottom_blob.channel(c);

                for (int i = 0; i < inner_h; i++)
                {
                    const float* ptr = (const float*)bottom_blob.channel(c) + dilation * i * w + x * w + y;
                    for (int j = 0; j < inner_w; j++)
                    {
                        outptr[j] = ptr[j * dilation];
                    }
                    outptr += inner_w;
                }
            }

            Option opt_g = opt;
            opt_g.blob_allocator = inner_top_blob.allocator;
            convolution_dilation1->forward(inner_bottom_blob, inner_top_blob, opt_g);

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int c = 0; c < num_output; c++)
            {
                float* outptr = (float*)top_blob.channel(c) + x * outw + y;
                for (int i = 0; i < inner_outh; i++)
                {
                    const float* ptr = (const float*)inner_top_blob.channel(c) + i * inner_outw;
                    for (int j = 0; j < inner_outw; j++)
                    {
                        outptr[j * dilation] = ptr[j];
                    }
                    outptr += dilation * outw;
                }
            }
        }
    }

    if (activation)
    {
        activation->forward_inplace(top_blob, opt);
    }

    return 0;
}